

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

bool flatbuffers::python::grpc::anon_unknown_0::ClientStreaming(RPCCall *method)

{
  bool bVar1;
  Value *pVVar2;
  bool local_6a;
  bool local_69;
  allocator<char> local_39;
  string local_38;
  Value *local_18;
  Value *val;
  RPCCall *method_local;
  
  val = (Value *)method;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"streaming",&local_39);
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(method->super_Definition).attributes,&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_69 = false;
  if (pVVar2 != (Value *)0x0) {
    local_18 = pVVar2;
    bVar1 = std::operator==(&pVVar2->constant,"client");
    local_6a = true;
    if (!bVar1) {
      local_6a = std::operator==(&local_18->constant,"bidi");
    }
    local_69 = local_6a;
  }
  return local_69;
}

Assistant:

bool ClientStreaming(const RPCCall *method) {
  const Value *val = method->attributes.Lookup("streaming");
  return val != nullptr && (val->constant == "client" || val->constant == "bidi");
}